

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

float64_t bf_get_float64_be(bfile_t *bfile)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  bfile_t *in_RDI;
  anon_union_8_2_d8cf4852 data;
  
  uVar1 = bf_get_uint8(in_RDI);
  uVar2 = bf_get_uint8(in_RDI);
  uVar3 = bf_get_uint8(in_RDI);
  uVar4 = bf_get_uint8(in_RDI);
  uVar5 = bf_get_uint8(in_RDI);
  uVar6 = bf_get_uint8(in_RDI);
  uVar7 = bf_get_uint8(in_RDI);
  uVar8 = bf_get_uint8(in_RDI);
  return (float64_t)
         CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(uVar6,
                                                  CONCAT11(uVar7,uVar8)))))));
}

Assistant:

float64_t
bf_get_float64_be(
    bfile_t * bfile )
{
    union {
        float64_t real;
        uint8_t   bytes[8];
    } data;

#ifndef WORDS_BIGENDIAN
    data.bytes[7] = bf_get_uint8( bfile );
    data.bytes[6] = bf_get_uint8( bfile );
    data.bytes[5] = bf_get_uint8( bfile );
    data.bytes[4] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[0] = bf_get_uint8( bfile );
#else /* WORDS_BIGENDIAN */
    data.bytes[0] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[4] = bf_get_uint8( bfile );
    data.bytes[5] = bf_get_uint8( bfile );
    data.bytes[6] = bf_get_uint8( bfile );
    data.bytes[7] = bf_get_uint8( bfile );
#endif /* WORDS_BIGENDIAN */

    return data.real;
}